

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_sha256h_arm(void *vd,void *vn,void *vm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar7 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vn;
  uVar5 = *(ulong *)((long)vn + 8);
  local_28 = *vm;
  uStack_20 = *(undefined8 *)((long)vm + 8);
  lVar4 = 0;
  do {
    uVar1 = (uint)uVar3;
    iVar8 = ((uVar1 << 7 | uVar1 >> 0x19) ^
            (uVar1 << 0x15 | uVar1 >> 0xb) ^ (uVar1 << 0x1a | uVar1 >> 6)) + (int)(uVar5 >> 0x20) +
            (((uint)(uVar3 >> 0x20) ^ (uint)uVar5) & uVar1 ^ (uint)uVar5) +
            *(int *)((long)&local_28 + lVar4 * 4);
    uVar5 = uVar5 << 0x20 | uVar3 >> 0x20;
    uVar3 = uVar3 << 0x20 | (ulong)(uint)((int)(uVar2 >> 0x20) + iVar8);
    uVar9 = (uint)(uVar7 >> 0x20);
    uVar6 = (uint)uVar7;
    uVar1 = (uint)uVar2;
    uVar2 = uVar2 << 0x20 | uVar7 >> 0x20;
    uVar7 = (ulong)(((uVar6 << 10 | uVar6 >> 0x16) ^
                    (uVar6 << 0x13 | uVar6 >> 0xd) ^ (uVar6 << 0x1e | uVar6 >> 2)) +
                    ((uVar9 | uVar6) & uVar1 | uVar9 & uVar6) + iVar8) | uVar7 << 0x20;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(ulong *)vd = uVar7;
  *(ulong *)((long)vd + 8) = uVar2;
  return;
}

Assistant:

void HELPER(crypto_sha256h)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    int i;

    for (i = 0; i < 4; i++) {
        uint32_t t = cho(CR_ST_WORD(n, 0), CR_ST_WORD(n, 1), CR_ST_WORD(n, 2))
                     + CR_ST_WORD(n, 3) + S1(CR_ST_WORD(n, 0))
                     + CR_ST_WORD(m, i);

        CR_ST_WORD(n, 3) = CR_ST_WORD(n, 2);
        CR_ST_WORD(n, 2) = CR_ST_WORD(n, 1);
        CR_ST_WORD(n, 1) = CR_ST_WORD(n, 0);
        CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3) + t;

        t += maj(CR_ST_WORD(d, 0), CR_ST_WORD(d, 1), CR_ST_WORD(d, 2))
             + S0(CR_ST_WORD(d, 0));

        CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
        CR_ST_WORD(d, 2) = CR_ST_WORD(d, 1);
        CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
        CR_ST_WORD(d, 0) = t;
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}